

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_immecho(CHAR_DATA *ch,char *argument)

{
  char *in_RSI;
  char buffer [9216];
  DESCRIPTOR_DATA *d;
  CHAR_DATA *in_stack_ffffffffffffdbf8;
  CHAR_DATA *in_stack_ffffffffffffdc00;
  char *in_stack_ffffffffffffdc08;
  char *in_stack_ffffffffffffdc10;
  DESCRIPTOR_DATA *local_18;
  
  if (*in_RSI == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  }
  else {
    for (local_18 = descriptor_list; local_18 != (DESCRIPTOR_DATA *)0x0; local_18 = local_18->next)
    {
      if ((local_18->connected == 0) && (0x33 < local_18->character->level)) {
        colorconv(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc00);
        send_to_char((char *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        send_to_char((char *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
      }
    }
  }
  return;
}

Assistant:

void do_immecho(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Global echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && (d->character->level > 51))
		{
			colorconv(buffer, argument, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}